

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O2

int testInvalidConvolutionNoBias(void)

{
  ulong uVar1;
  ModelDescription *pMVar2;
  FeatureDescription *pFVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *this;
  NeuralNetwork *pNVar5;
  NeuralNetworkLayer *this_00;
  ConvolutionLayerParams *this_01;
  WeightParams *this_02;
  ostream *poVar6;
  undefined8 *puVar7;
  int iVar8;
  bool bVar9;
  Model m1;
  Result res;
  
  CoreML::Specification::Model::Model(&m1);
  pMVar2 = CoreML::Specification::Model::_internal_mutable_description(&m1);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->input_);
  uVar1 = (pFVar3->super_MessageLite)._internal_metadata_.ptr_;
  puVar7 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar7 = (undefined8 *)*puVar7;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar3->name_,"input",puVar7);
  pFVar4 = CoreML::Specification::FeatureDescription::_internal_mutable_type(pFVar3);
  this = CoreML::Specification::FeatureType::_internal_mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(this,3);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(this,100);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(this,100);
  pMVar2 = CoreML::Specification::Model::_internal_mutable_description(&m1);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->output_);
  uVar1 = (pFVar3->super_MessageLite)._internal_metadata_.ptr_;
  puVar7 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar7 = (undefined8 *)*puVar7;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar3->name_,"probs",puVar7);
  pFVar4 = CoreML::Specification::FeatureDescription::_internal_mutable_type(pFVar3);
  CoreML::Specification::FeatureType::_internal_mutable_multiarraytype(pFVar4);
  pNVar5 = CoreML::Specification::Model::_internal_mutable_neuralnetwork(&m1);
  this_00 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                      (&pNVar5->layers_);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"probs");
  this_01 = CoreML::Specification::NeuralNetworkLayer::_internal_mutable_convolution(this_00);
  this_01->outputchannels_ = 5;
  this_01->kernelchannels_ = 3;
  CoreML::Specification::ConvolutionLayerParams::_internal_add_kernelsize(this_01,2);
  CoreML::Specification::ConvolutionLayerParams::_internal_add_kernelsize(this_01,5);
  this_01->hasbias_ = true;
  CoreML::Specification::ConvolutionLayerParams::_internal_mutable_valid(this_01);
  iVar8 = 0x96;
  while (bVar9 = iVar8 != 0, iVar8 = iVar8 + -1, bVar9) {
    this_02 = CoreML::Specification::ConvolutionLayerParams::_internal_mutable_weights(this_01);
    CoreML::Specification::WeightParams::_internal_add_floatvalue(this_02,1.0);
  }
  CoreML::validate<(MLModelType)500>(&res,&m1);
  bVar9 = CoreML::Result::good(&res);
  if (bVar9) {
    poVar6 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,0x5c9);
    poVar6 = std::operator<<(poVar6,": error: ");
    poVar6 = std::operator<<(poVar6,"!((res).good())");
    poVar6 = std::operator<<(poVar6," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::Model::~Model(&m1);
  return (uint)bVar9;
}

Assistant:

int testInvalidConvolutionNoBias() {

    Specification::Model m1;

    int output_channels = 5;
    int kernel_channels = 3;
    int kernel_height = 2;
    int kernel_width = 5;
    int nGroups = 1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(3);
    shape->add_shape(100);
    shape->add_shape(100);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *convLayer = nn->add_layers();
    convLayer->add_input("input");
    convLayer->add_output("probs");
    auto *params = convLayer->mutable_convolution();
    params->set_outputchannels(5);
    params->set_kernelchannels(3);
    params->add_kernelsize(kernel_height);
    params->add_kernelsize(kernel_width);

    params->set_hasbias(true);

    (void)params->mutable_valid();

    for (int i = 0; i < output_channels * (kernel_channels / nGroups) * kernel_height * kernel_width; i++) {
        params->mutable_weights()->add_floatvalue(1.0);
    }

    // Not specifying the right number of weights should be invalid

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    return 0;

}